

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O2

string * __thiscall
deqp::RobustBufferAccessBehavior::StorageBufferTest::getComputeShader_abi_cxx11_
          (string *__return_storage_ptr__,StorageBufferTest *this)

{
  int iVar1;
  ulong uVar2;
  TestError *this_00;
  allocator<char> local_21;
  size_t position;
  
  position = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 430 core\n\nlayout (local_size_x = 4, local_size_y = 1, local_size_z = 1) in;\n\nlayout (binding = 1, std430) buffer Source {\n    float data[];\n} source;\n\nlayout (binding = 0, std430) buffer Destination {\n    float data[];\n} destination;\n\nvoid main()\n{\n    const uint index_destination = gl_LocalInvocationID.x + OFFSET;\n    const uint index_source      = gl_LocalInvocationID.x + OFFSET;\n\n    destination.data[index_destination] = source.data[index_source];\n}\n\n"
             ,&local_21);
  uVar2 = (ulong)this->m_test_case;
  if (uVar2 < 3) {
    iVar1 = *(int *)(&DAT_017d1124 + uVar2 * 4);
    replaceToken("OFFSET",&position,&DAT_017d1118 + *(int *)(&DAT_017d1118 + uVar2 * 4),
                 __return_storage_ptr__);
    replaceToken("OFFSET",&position,&DAT_017d1124 + iVar1,__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
             ,0xd62);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string StorageBufferTest::getComputeShader()
{
	static const GLchar* cs = "#version 430 core\n"
							  "\n"
							  "layout (local_size_x = 4, local_size_y = 1, local_size_z = 1) in;\n"
							  "\n"
							  "layout (binding = 1, std430) buffer Source {\n"
							  "    float data[];\n"
							  "} source;\n"
							  "\n"
							  "layout (binding = 0, std430) buffer Destination {\n"
							  "    float data[];\n"
							  "} destination;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    const uint index_destination = gl_LocalInvocationID.x + OFFSET;\n"
							  "    const uint index_source      = gl_LocalInvocationID.x + OFFSET;\n"
							  "\n"
							  "    destination.data[index_destination] = source.data[index_source];\n"
							  "}\n"
							  "\n";

	const GLchar* destination_offset;
	size_t		  position = 0;
	std::string   source   = cs;
	const GLchar* source_offset;

	switch (m_test_case)
	{
	case VALID:
		destination_offset = "0";
		source_offset	  = "0";
		break;
	case SOURCE_INVALID:
		destination_offset = "0";
		source_offset	  = "16";
		break;
	case DESTINATION_INVALID:
		destination_offset = "16";
		source_offset	  = "0";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	replaceToken("OFFSET", position, destination_offset, source);
	replaceToken("OFFSET", position, source_offset, source);

	return source;
}